

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.cpp
# Opt level: O1

uchar char_name_to_char(string *name)

{
  pointer pcVar1;
  const_iterator cVar2;
  uchar *puVar3;
  string local_58;
  string local_38;
  
  if (name->_M_string_length == 1) {
    puVar3 = (uchar *)(name->_M_dataplus)._M_p;
  }
  else {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + name->_M_string_length);
    normalize_char_name(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)name,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
            ::find(&charnames_abi_cxx11_._M_t,name);
    if ((_Rb_tree_header *)cVar2._M_node == &charnames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header
       ) {
      return '\0';
    }
    puVar3 = (uchar *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                      ::at(&charnames_abi_cxx11_,name);
  }
  return *puVar3;
}

Assistant:

unsigned char char_name_to_char(std::string name)
{
    if(name.length() == 1)
        return name[0];
    name = normalize_char_name(name);
    if(charnames.count(name))
        return charnames.at(name);
    return 0;
}